

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_expressions.cpp
# Opt level: O3

ParameterValueAssignmentSyntax * __thiscall
slang::parsing::Parser::parseParameterValueAssignment(Parser *this)

{
  bool bVar1;
  int iVar2;
  undefined8 uVar3;
  SourceLocation location;
  ParamAssignmentSyntax *pPVar4;
  undefined4 extraout_var;
  ParameterValueAssignmentSyntax *pPVar5;
  Info *extraout_RDX;
  Info *pIVar6;
  Info *extraout_RDX_00;
  TokenKind TVar7;
  TokenKind TVar8;
  Token TVar9;
  Token TVar10;
  Token hash;
  Token openParen;
  Token local_208;
  _Variadic_union<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> local_1f8;
  undefined1 local_1e8;
  undefined8 local_1e0;
  Token local_1d8;
  undefined1 local_1c8 [24];
  undefined1 auStack_1b0 [24];
  __extent_storage<18446744073709551615UL> local_198;
  
  bVar1 = ParserBase::peek(&this->super_ParserBase,Hash);
  if (!bVar1) {
    return (ParameterValueAssignmentSyntax *)0x0;
  }
  TVar9 = ParserBase::consume(&this->super_ParserBase);
  hash.info = TVar9.info;
  uVar3 = TVar9._0_8_;
  Token::Token(&local_1d8);
  Token::Token(&local_208);
  local_1d8 = ParserBase::expect(&this->super_ParserBase,OpenParenthesis);
  if ((local_1d8._0_4_ >> 0x10 & 1) != 0) {
    location = Token::location(&local_1d8);
    local_208 = ParserBase::missingToken(&this->super_ParserBase,CloseParenthesis,location);
    auStack_1b0._16_8_ = (pointer)0x0;
    auStack_1b0._8_8_ = (Info *)0x0;
    goto LAB_00665814;
  }
  local_1c8._0_8_ = auStack_1b0;
  local_1c8._8_8_ = 0;
  local_1c8._16_8_ = (SyntaxNode *)0x10;
  local_1e0 = uVar3;
  TVar9 = ParserBase::peek(&this->super_ParserBase);
  bVar1 = slang::syntax::SyntaxFacts::isEndOfParenList(TVar9.kind);
  if (bVar1) {
    local_208 = ParserBase::expect(&this->super_ParserBase,CloseParenthesis);
LAB_006657de:
    pIVar6 = local_208.info;
  }
  else {
    bVar1 = slang::syntax::SyntaxFacts::isPossibleParamAssignment(TVar9.kind);
    if (bVar1) {
      do {
        pIVar6 = TVar9.info;
        pPVar4 = parseParamValue(this);
        local_1f8._M_rest = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)pPVar4;
        local_1e8 = 1;
        SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
                  ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)local_1c8,
                   (TokenOrSyntax *)&local_1f8._M_first);
        TVar10 = ParserBase::peek(&this->super_ParserBase);
        TVar8 = TVar10.kind;
        bVar1 = slang::syntax::SyntaxFacts::isEndOfParenList(TVar8);
        if (TVar8 == EndOfFile || bVar1) break;
        if (TVar8 != Comma) {
          ParserBase::expect(&this->super_ParserBase,Comma);
          do {
            bVar1 = ParserBase::
                    skipBadTokens<&slang::syntax::SyntaxFacts::isPossibleParamAssignment,&slang::syntax::SyntaxFacts::isEndOfParenList>
                              (&this->super_ParserBase,(DiagCode)0x2d0005,false);
            if (!bVar1) {
              local_208 = ParserBase::expect(&this->super_ParserBase,CloseParenthesis);
              goto LAB_006657de;
            }
            bVar1 = ParserBase::peek(&this->super_ParserBase,Comma);
          } while (!bVar1);
        }
        local_1f8._M_first._M_storage =
             (_Uninitialized<slang::parsing::Token,_true>)
             ParserBase::expect(&this->super_ParserBase,Comma);
        local_1e8 = 0;
        SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
                  ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)local_1c8,
                   (TokenOrSyntax *)&local_1f8._M_first);
        TVar10 = ParserBase::peek(&this->super_ParserBase);
        TVar8 = TVar10.kind;
        bVar1 = slang::syntax::SyntaxFacts::isEndOfParenList(TVar8);
        if (TVar8 == EndOfFile || bVar1) {
          ParserBase::reportMisplacedSeparator(&this->super_ParserBase);
          break;
        }
        TVar7 = TVar9.kind;
        TVar9 = TVar10;
      } while ((pIVar6 != TVar10.info || TVar7 != TVar8) ||
              (bVar1 = ParserBase::
                       skipBadTokens<&slang::syntax::SyntaxFacts::isPossibleParamAssignment,&slang::syntax::SyntaxFacts::isEndOfParenList>
                                 (&this->super_ParserBase,(DiagCode)0x2d0005,true), bVar1));
      local_208 = ParserBase::expect(&this->super_ParserBase,CloseParenthesis);
      goto LAB_006657de;
    }
    ParserBase::reportMissingList
              (&this->super_ParserBase,TVar9,CloseParenthesis,&local_208,(DiagCode)0x2d0005);
    pIVar6 = extraout_RDX;
  }
  iVar2 = SmallVectorBase<slang::syntax::TokenOrSyntax>::copy
                    ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)local_1c8,
                     (EVP_PKEY_CTX *)(this->super_ParserBase).alloc,(EVP_PKEY_CTX *)pIVar6);
  uVar3 = local_1e0;
  auStack_1b0._16_8_ = CONCAT44(extraout_var,iVar2);
  auStack_1b0._8_8_ = extraout_RDX_00;
  if ((pointer)local_1c8._0_8_ != (pointer)auStack_1b0) {
    operator_delete((void *)local_1c8._0_8_);
  }
LAB_00665814:
  local_1c8._8_4_ = 3;
  local_1c8._16_8_ = (SyntaxNode *)0x0;
  auStack_1b0._0_8_ = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)0x0;
  local_1c8._0_8_ = &PTR_getChild_00c95a70;
  hash.kind = (short)uVar3;
  hash._2_1_ = (char)((ulong)uVar3 >> 0x10);
  hash.numFlags.raw = (char)((ulong)uVar3 >> 0x18);
  hash.rawLen = (int)((ulong)uVar3 >> 0x20);
  local_198._M_extent_value = auStack_1b0._8_8_;
  pPVar5 = slang::syntax::SyntaxFactory::parameterValueAssignment
                     (&this->factory,hash,local_1d8,
                      (SeparatedSyntaxList<slang::syntax::ParamAssignmentSyntax> *)local_1c8,
                      local_208);
  return pPVar5;
}

Assistant:

ParameterValueAssignmentSyntax* Parser::parseParameterValueAssignment() {
    if (!peek(TokenKind::Hash))
        return nullptr;

    auto hash = consume();

    Token openParen;
    Token closeParen;
    std::span<TokenOrSyntax> list;
    parseList<isPossibleParamAssignment, isEndOfParenList>(
        TokenKind::OpenParenthesis, TokenKind::CloseParenthesis, TokenKind::Comma, openParen, list,
        closeParen, RequireItems::False, diag::ExpectedArgument,
        [this] { return &parseParamValue(); });

    return &factory.parameterValueAssignment(hash, openParen, list, closeParen);
}